

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# camera.c
# Opt level: O3

PerspectiveCamera *
create_perspective_camera
          (PerspectiveCamera *__return_storage_ptr__,Vec3 pos,Vec3 target,float ratio,float fov)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  float in_XMM0_Dc;
  float in_XMM0_Dd;
  float fVar4;
  float fVar6;
  undefined1 auVar5 [16];
  float fVar7;
  float in_XMM2_Dc;
  float in_XMM2_Dd;
  float fVar8;
  float fVar9;
  Vec3 v;
  Vec3 v_00;
  undefined1 local_58 [8];
  float fStack_50;
  float fStack_4c;
  float fVar3;
  
  (__return_storage_ptr__->eye).x = (float)(int)pos._0_8_;
  (__return_storage_ptr__->eye).y = (float)(int)((ulong)pos._0_8_ >> 0x20);
  (__return_storage_ptr__->eye).z = pos.z;
  __return_storage_ptr__->depth = 1.0;
  v.z = pos.z - target.z;
  v.x = pos.x - target.x;
  v.y = pos.y - target.y;
  local_58._4_4_ = v.y;
  local_58._0_4_ = v.x;
  fStack_50 = in_XMM0_Dc - in_XMM2_Dc;
  fStack_4c = in_XMM0_Dd - in_XMM2_Dd;
  fVar3 = norm(v);
  fVar9 = v.z / fVar3;
  auVar5._4_4_ = fVar3;
  auVar5._0_4_ = fVar3;
  auVar5._8_4_ = fVar3;
  auVar5._12_4_ = fVar3;
  auVar5 = divps(_local_58,auVar5);
  __return_storage_ptr__->basis[2].x = (float)(int)auVar5._0_8_;
  __return_storage_ptr__->basis[2].y = (float)(int)((ulong)auVar5._0_8_ >> 0x20);
  fVar4 = auVar5._0_4_;
  fVar6 = auVar5._4_4_;
  fVar8 = fVar6 * 0.00123 + fVar4 * 0.000987;
  __return_storage_ptr__->basis[2].z = fVar9;
  v_00.x = fVar9 * -0.000987 - fVar6;
  fVar7 = fVar4 - fVar9 * 0.00123;
  v_00.y = fVar7;
  v_00.z = fVar8;
  fVar3 = norm(v_00);
  fVar8 = fVar8 / fVar3;
  auVar2._4_4_ = fVar7;
  auVar2._0_4_ = v_00.x;
  auVar2._8_4_ = 0;
  auVar2._12_4_ = fVar6;
  auVar1._4_4_ = fVar3;
  auVar1._0_4_ = fVar3;
  auVar1._8_4_ = fVar3;
  auVar1._12_4_ = fVar3;
  auVar5 = divps(auVar2,auVar1);
  __return_storage_ptr__->basis[0].x = (float)(int)auVar5._0_8_;
  __return_storage_ptr__->basis[0].y = (float)(int)((ulong)auVar5._0_8_ >> 0x20);
  __return_storage_ptr__->basis[0].z = fVar8;
  __return_storage_ptr__->basis[1].x = fVar8 * fVar6 - fVar9 * auVar5._4_4_;
  __return_storage_ptr__->basis[1].y = fVar9 * auVar5._0_4_ - fVar8 * fVar4;
  __return_storage_ptr__->basis[1].z = auVar5._4_4_ * fVar4 - auVar5._0_4_ * fVar6;
  fVar3 = atanf((fov * 3.1415927) / 360.0);
  __return_storage_ptr__->xscale = fVar3;
  __return_storage_ptr__->yscale = fVar3 / ratio;
  return __return_storage_ptr__;
}

Assistant:

PerspectiveCamera create_perspective_camera(Vec3 pos, Vec3 target, float ratio, float fov) {
    PerspectiveCamera cam;
    cam.eye = pos;
    cam.depth = 1.0f;

    cam.basis[2] = normalized(vsub(pos, target));
    cam.basis[0] = normalized(
        cross((Vec3) {0.00123f, -0.000987f, 1.0f}, cam.basis[2])
        );
    cam.basis[1] = cross(cam.basis[2], cam.basis[0]);

    cam.xscale = atanf(fov * PI / 360.0f);
    cam.yscale = cam.xscale / ratio;

    return cam;
}